

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error processInternalEntity(XML_Parser parser,ENTITY *entity,XML_Bool betweenDecl)

{
  int startTagLevel;
  XML_Error XVar1;
  OPEN_INTERNAL_ENTITY *pOVar2;
  char *end;
  char *next;
  XML_Account account;
  char *s;
  
  pOVar2 = parser->m_freeInternalEntities;
  if (pOVar2 == (OPEN_INTERNAL_ENTITY *)0x0) {
    pOVar2 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
    if (pOVar2 == (OPEN_INTERNAL_ENTITY *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  else {
    parser->m_freeInternalEntities = pOVar2->next;
  }
  entity->open = '\x01';
  entity->processed = 0;
  pOVar2->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = pOVar2;
  pOVar2->entity = entity;
  startTagLevel = parser->m_tagLevel;
  pOVar2->startTagLevel = startTagLevel;
  pOVar2->betweenDecl = '\0';
  pOVar2->internalEventPtr = (char *)0x0;
  pOVar2->internalEventEndPtr = (char *)0x0;
  s = entity->textPtr;
  end = s + entity->textLen;
  account = (XML_Account)s;
  XVar1 = doContent(parser,startTagLevel,parser->m_internalEncoding,s,end,
                    (char **)&stack0xffffffffffffffd0,'\0',account);
  if (XVar1 == XML_ERROR_NONE) {
    if ((end == s) || ((parser->m_parsingStatus).parsing != XML_SUSPENDED)) {
      entity->open = '\0';
      parser->m_openInternalEntities = pOVar2->next;
      pOVar2->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = pOVar2;
    }
    else {
      entity->processed = (int)s - account;
      parser->m_processor = internalEntityProcessor;
    }
    XVar1 = XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error
processInternalEntity(XML_Parser parser, ENTITY *entity, XML_Bool betweenDecl) {
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity;

  if (parser->m_freeInternalEntities) {
    openEntity = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity->next;
  } else {
    openEntity
        = (OPEN_INTERNAL_ENTITY *)MALLOC(parser, sizeof(OPEN_INTERNAL_ENTITY));
    if (! openEntity)
      return XML_ERROR_NO_MEMORY;
  }
  entity->open = XML_TRUE;
#ifdef XML_DTD
  entityTrackingOnOpen(parser, entity, __LINE__);
#endif
  entity->processed = 0;
  openEntity->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = openEntity;
  openEntity->entity = entity;
  openEntity->startTagLevel = parser->m_tagLevel;
  openEntity->betweenDecl = betweenDecl;
  openEntity->internalEventPtr = NULL;
  openEntity->internalEventEndPtr = NULL;
  textStart = (const char *)entity->textPtr;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

#ifdef XML_DTD
  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_FALSE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else
#endif /* XML_DTD */
    result = doContent(parser, parser->m_tagLevel, parser->m_internalEncoding,
                       textStart, textEnd, &next, XML_FALSE,
                       XML_ACCOUNT_ENTITY_EXPANSION);

  if (result == XML_ERROR_NONE) {
    if (textEnd != next && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
      entity->processed = (int)(next - textStart);
      parser->m_processor = internalEntityProcessor;
    } else {
#ifdef XML_DTD
      entityTrackingOnClose(parser, entity, __LINE__);
#endif /* XML_DTD */
      entity->open = XML_FALSE;
      parser->m_openInternalEntities = openEntity->next;
      /* put openEntity back in list of free instances */
      openEntity->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = openEntity;
    }
  }
  return result;
}